

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::BadNameString::~BadNameString(BadNameString *this)

{
  void *in_RDI;
  
  ~BadNameString((BadNameString *)0x1c7978);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }